

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlGlyphDefn.h
# Opt level: O0

void __thiscall GdlGlyphDefn::GdlGlyphDefn(GdlGlyphDefn *this,GlyphType glft,int nFirst,int nLast)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  GdlGlyphClassMember *in_RDI;
  
  GdlGlyphClassMember::GdlGlyphClassMember(in_RDI);
  (in_RDI->super_GdlDefn)._vptr_GdlDefn = (_func_int **)&PTR__GdlGlyphDefn_0036a9e0;
  *(undefined4 *)&in_RDI->field_0x34 = in_ESI;
  *(undefined4 *)&in_RDI[1].super_GdlDefn._vptr_GdlDefn = in_EDX;
  *(undefined4 *)((long)&in_RDI[1].super_GdlDefn._vptr_GdlDefn + 4) = in_ECX;
  *(undefined2 *)&in_RDI[1].super_GdlDefn.super_GdlObject.m_lnf.m_nLinePre = 0;
  in_RDI[1].super_GdlDefn.super_GdlObject.m_lnf.m_nLineOrig = 0;
  *(undefined8 *)&in_RDI[1].super_GdlDefn.super_GdlObject.m_lnf.m_staFile = 0;
  std::__cxx11::string::string((string *)&in_RDI[1].super_GdlDefn.super_GdlObject.m_lnf.field_0x10);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x14d058);
  std::vector<GlyphBoundaries,_std::allocator<GlyphBoundaries>_>::vector
            ((vector<GlyphBoundaries,_std::allocator<GlyphBoundaries>_> *)0x14d069);
  *(undefined1 *)&in_RDI[3].super_GdlDefn._vptr_GdlDefn = 0;
  *(undefined1 *)((long)&in_RDI[3].super_GdlDefn._vptr_GdlDefn + 1) = 0;
  if (*(int *)&in_RDI->field_0x34 == 3) {
    *(short *)&in_RDI[1].super_GdlDefn.super_GdlObject.m_lnf.m_nLinePre =
         (short)*(undefined4 *)((long)&in_RDI[1].super_GdlDefn._vptr_GdlDefn + 4);
    *(undefined4 *)((long)&in_RDI[1].super_GdlDefn._vptr_GdlDefn + 4) =
         *(undefined4 *)&in_RDI[1].super_GdlDefn._vptr_GdlDefn;
  }
  return;
}

Assistant:

GdlGlyphDefn(GlyphType glft, int nFirst, int nLast)
		:	GdlGlyphClassMember(),
			m_glft(glft),
			m_nFirst(nFirst),
			m_nLast(nLast),
			m_wCodePage(0),
			m_nUnicodeInput(0),
			m_pglfOutput(NULL),
			m_fGAResolved(false),
			m_fNoRangeCheck(false)
	{
		Assert(m_glft != kglftPseudo);

		if (m_glft == kglftCodepoint)
		{
			m_wCodePage = (utf16)m_nLast;
			m_nLast = m_nFirst;
		}
	}